

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
          (string *__return_storage_ptr__,void *this,char *extension)

{
  string local_48;
  undefined1 local_21;
  char *local_20;
  char *extension_local;
  BinaryWriterSpec *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = extension;
  extension_local = (char *)this;
  this_local = (BinaryWriterSpec *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 0x50));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
  std::__cxx11::to_string(&local_48,*(unsigned_long *)((long)this + 0x80));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_20);
  ConvertBackslashToSlash(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryWriterSpec::GetModuleFilename(const char* extension) {
  std::string result = module_filename_noext_;
  result += '.';
  result += std::to_string(num_modules_);
  result += extension;
  ConvertBackslashToSlash(&result);
  return result;
}